

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<14>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<14> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  int MT_00;
  pointer pvVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
  *entry;
  pointer pvVar5;
  int MT;
  int local_a0;
  int local_9c;
  _Head_base<5UL,_long,_false> local_98;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  double local_78;
  StructureDivision local_70;
  
  MT_00 = (this->super_Base).MT_;
  local_78 = (double)(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  local_80 = (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  pvVar5 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar1 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = MF;
  local_9c = MAT;
  local_98._M_head_impl = (long)it;
  local_8c = MAT;
  local_88 = MF;
  local_84 = MT_00;
  iVar2 = LTT(this);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)iVar2;
  uVar4 = (long)(this->photons_).
                super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->photons_).
                super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    iVar2 = *(int *)&(this->super_Base).field_0x14;
  }
  else {
    iVar2 = (int)(uVar4 >> 7);
  }
  iVar3 = NI(this);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(long)iVar3;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_80;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_78;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)(long)iVar2;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)(ulong)(pvVar5 == pvVar1);
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_70,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98._M_head_impl,local_8c,local_88,MT_00);
  pvVar1 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar5 = (this->photons_).
                super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
    super__Head_base<5UL,_long,_false>._M_head_impl =
         (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)local_98._M_head_impl;
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
         (long)&local_9c;
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_a0;
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)&local_84;
    std::
    visit<njoy::ENDFtk::section::Type<14>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,njoy::ENDFtk::section::Type<14>::LegendreDistributions,njoy::ENDFtk::section::Type<14>::TabulatedDistributions>const&>
              ((anon_class_32_4_f17ee1e6 *)&local_70,pvVar5);
  }
  sectionEndRecord(&local_70,local_9c,local_a0);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
            (&local_70,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98._M_head_impl);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  int MT = this->MT();
  ControlRecord( this->ZA(), this->AWR(), this->LI(), this->LTT(),
                 this->NK(), this->NI() ).print( it, MAT, MF, MT );
  for ( const auto& entry : this->photons_ ) {

    std::visit( [&] ( const auto& v )
                    { return v.print( it, MAT, MF, MT ); },
                entry );
  }
  SEND( MAT, MF ).print( it );
}